

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O2

void __thiscall
Clasp::SingleOwnerPtr<Clasp::ProgramBuilder,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::ProgramBuilder,_Clasp::DeleteObject> *this,ProgramBuilder *x)

{
  ProgramBuilder *pPVar1;
  
  pPVar1 = (ProgramBuilder *)(this->ptr_ & 0xfffffffffffffffe);
  if (((this->ptr_ & 1) != 0 && pPVar1 != x) &&
     (this->ptr_ = (uintp)pPVar1, pPVar1 != (ProgramBuilder *)0x0)) {
    (*pPVar1->_vptr_ProgramBuilder[1])();
  }
  this->ptr_ = (ulong)x | 1;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}